

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_string.cpp
# Opt level: O3

bool __thiscall pstore::indirect_string::operator<(indirect_string *this,indirect_string *rhs)

{
  ulong uVar1;
  size_t slen;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  raw_sstring_view rVar6;
  raw_sstring_view rVar7;
  shared_sstring_view rhs_owner;
  shared_sstring_view lhs_owner;
  sstring_view<std::shared_ptr<const_char>_> local_68;
  sstring_view<std::shared_ptr<const_char>_> local_48;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_30;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_28;
  
  if (this->db_ != rhs->db_) {
    assert_failed("&db_ == &rhs.db_",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/indirect_string.cpp"
                  ,0x38);
  }
  local_28.ptr_ = &local_48;
  local_48.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_48.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48.size_ = 0;
  local_68.size_ = 0;
  local_68.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_68.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::ensure_invariant(&local_28);
  rVar6 = as_string_view(this,local_28);
  uVar2 = rVar6.size_;
  local_30.ptr_ = &local_68;
  gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::ensure_invariant(&local_30);
  rVar7 = as_string_view(rhs,local_30);
  uVar3 = rVar7.size_;
  uVar1 = uVar2;
  if (uVar3 < uVar2) {
    uVar1 = uVar3;
  }
  if (uVar1 != 0) {
    uVar4 = 0;
    do {
      if (rVar7.ptr_[uVar4] != rVar6.ptr_[uVar4]) {
        bVar5 = rVar6.ptr_[uVar4] < rVar7.ptr_[uVar4];
        goto LAB_0015c7dd;
      }
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  bVar5 = uVar2 < uVar3;
LAB_0015c7dd:
  if (local_68.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_48.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return bVar5;
}

Assistant:

bool indirect_string::operator< (indirect_string const & rhs) const {
        PSTORE_ASSERT (&db_ == &rhs.db_);
        shared_sstring_view lhs_owner;
        shared_sstring_view rhs_owner;
        return this->as_string_view (&lhs_owner) < rhs.as_string_view (&rhs_owner);
    }